

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

MessageProcessingResult __thiscall
helics::FederateState::processActionMessage(FederateState *this,ActionMessage *cmd)

{
  ushort uVar1;
  action_t aVar2;
  GlobalFederateId fedId;
  TimeCoordinator *pTVar3;
  size_t __n;
  _Alloc_hider _Var4;
  size_type sVar5;
  _Storage<helics::MessageProcessingResult,_true> _Var6;
  char cVar7;
  MessageProcessingResult MVar8;
  _Optional_payload_base<helics::MessageProcessingResult> _Var9;
  int iVar10;
  Time newValueTime;
  Time newMessageTime;
  Time TVar11;
  char *__s;
  ActionMessage *in_RDX;
  IterationRequest iterate;
  _Optional_payload_base<helics::MessageProcessingResult> unaff_BP;
  action_t startingAction;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  bool bVar12;
  string_view fmt;
  string_view logMessageSource;
  string_view query;
  format_args args;
  string_view message;
  tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> proc_result;
  ActionMessage queryResp;
  int in_stack_fffffffffffffedc;
  string local_118;
  pointer local_f8;
  size_t sStack_f0;
  undefined1 local_e8 [64];
  SmallBuffer local_a8;
  
  sVar5 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
  _Var4._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
  if (0x17 < this->maxLogLevel) {
    prettyPrintString_abi_cxx11_(&local_118,(helics *)cmd,in_RDX);
    local_f8 = local_118._M_dataplus._M_p;
    sStack_f0 = local_118._M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x15;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_f8;
    ::fmt::v11::vformat_abi_cxx11_((string *)local_e8,(v11 *)"processing command {}",fmt,args);
    message._M_str._4_4_ = local_e8._4_4_;
    message._M_str._0_4_ = local_e8._0_4_;
    message._M_len._4_4_ = local_e8._12_4_;
    message._M_len._0_4_ = local_e8._8_4_;
    logMessageSource._M_str = _Var4._M_p;
    logMessageSource._M_len = sVar5;
    logMessage(this,0x18,logMessageSource,message,false);
    if ((undefined1 *)CONCAT44(local_e8._4_4_,local_e8._0_4_) != local_e8 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_e8._4_4_,local_e8._0_4_),
                      CONCAT44(local_e8._20_4_,local_e8._16_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
  }
  if (((cmd->messageAction == cmd_time_request) &&
      ((cmd->source_id).gid == (this->global_id)._M_i.gid)) && ((cmd->flags & 0x20) != 0)) {
    LOCK();
    (this->requestingMode)._M_base._M_i = true;
    UNLOCK();
    uVar1 = cmd->flags;
    iterate = ((uVar1 & 4) == 0) + FORCE_ITERATION;
    if ((uVar1 & 1) == 0) {
      iterate = (IterationRequest)uVar1 & FORCE_ITERATION;
    }
    pTVar3 = (this->timeCoord)._M_t.
             super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
             .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
    TVar11.internalTimeCode = (cmd->actionTime).internalTimeCode;
    newValueTime = nextValueTime(this);
    newMessageTime = nextMessageTime(this);
    TimeCoordinator::timeRequest(pTVar3,TVar11,iterate,newValueTime,newMessageTime);
    this->timeGranted_mode = false;
    _Var6._M_value = processDelayQueue(this);
    unaff_BP._M_engaged = false;
    unaff_BP._M_payload._M_value = _Var6._M_value;
    if (DELAY_MESSAGE < _Var6._M_value) {
      return (MessageProcessingResult)_Var6;
    }
    ActionMessage::setAction(cmd,cmd_time_check);
  }
  processCoordinatorMessage
            ((helics *)&local_f8,cmd,
             (this->timeCoord)._M_t.
             super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
             .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl,
             (this->state)._M_i,this->timeGranted_mode,(GlobalFederateId)(this->global_id)._M_i.gid)
  ;
  _Var9 = (_Optional_payload_base<helics::MessageProcessingResult>)
          checkProcResult(this,(tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool>
                                *)&local_f8,cmd);
  if (((ushort)_Var9 >> 8 & 1) != 0) goto LAB_0031aa13;
  aVar2 = cmd->messageAction;
  if (aVar2 < cmd_remove_named_publication) {
    if (aVar2 < cmd_exec_request) {
      if (aVar2 < cmd_user_disconnect) {
        if (aVar2 == cmd_query) {
LAB_0031a80e:
          startingAction = cmd_query_reply_ordered;
          if (aVar2 == cmd_query) {
            startingAction = cmd_query_reply;
          }
          ActionMessage::ActionMessage((ActionMessage *)local_e8,startingAction);
          local_e8._16_4_ = (cmd->source_id).gid;
          local_e8._8_4_ = (cmd->dest_id).gid;
          local_e8._4_4_ = cmd->messageID;
          local_e8._24_2_ = cmd->counter;
          query._M_str = (char *)(cmd->payload).heap;
          query._M_len = (cmd->payload).bufferSize;
          processQueryActual_abi_cxx11_(&local_118,this,query);
          _Var4._M_p = local_118._M_dataplus._M_p;
          if ((byte *)local_118._M_dataplus._M_p == local_a8.heap) {
            local_a8.bufferSize = local_118._M_string_length;
          }
          else {
            SmallBuffer::reserve(&local_a8,local_118._M_string_length);
            local_a8.bufferSize = local_118._M_string_length;
            if (local_118._M_string_length != 0) {
              memcpy(local_a8.heap,_Var4._M_p,local_118._M_string_length);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          routeMessage(this,(ActionMessage *)local_e8);
          ActionMessage::~ActionMessage((ActionMessage *)local_e8);
        }
        else if (aVar2 == cmd_send_command) {
LAB_0031a76c:
          sendCommand(this,cmd);
        }
        else if (((aVar2 == cmd_fed_ack) && ((this->state)._M_i == CREATED)) &&
                ((__n = (cmd->payload).bufferSize, __n == (this->name)._M_string_length &&
                 ((__n == 0 ||
                  (iVar10 = bcmp((cmd->payload).heap,(this->name)._M_dataplus._M_p,__n), iVar10 == 0
                  )))))) {
          uVar1 = cmd->flags;
          if ((uVar1 & 0x10) == 0) {
            if ((uVar1 & 0x20) != 0) {
              if ((char)uVar1 < '\0') {
                this->timeMethod = ASYNC;
              }
              else {
                this->timeMethod = GLOBAL;
                pTVar3 = (this->timeCoord)._M_t.
                         super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                         .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
                (**(code **)((long)(pTVar3->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator +
                            0x28))(pTVar3,1);
                pTVar3 = (this->timeCoord)._M_t.
                         super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                         .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
                (**(code **)((long)(pTVar3->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator +
                            0x20))(pTVar3,1);
                BaseTimeCoordinator::setAsParent
                          (&((this->timeCoord)._M_t.
                             super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                             .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl)
                            ->super_BaseTimeCoordinator,(GlobalFederateId)0x1);
              }
              ((this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
               .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl)->globalTime =
                   true;
            }
            LOCK();
            (this->global_id)._M_i.gid = (cmd->dest_id).gid;
            UNLOCK();
            LOCK();
            (this->interfaceInformation).global_id._M_i.gid = (cmd->dest_id).gid;
            UNLOCK();
            (((this->timeCoord)._M_t.
              super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
              ._M_t.
              super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
              .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl)->
            super_BaseTimeCoordinator).mSourceId.gid = (this->global_id)._M_i.gid;
            _Var9._M_payload = (_Storage<helics::MessageProcessingResult,_true>)0x0;
            _Var9._M_engaged = false;
          }
          else {
            if ((this->state)._M_i != ERRORED) {
              LOCK();
              (this->state)._M_i = ERRORED;
              UNLOCK();
            }
            __s = commandErrorString(in_stack_fffffffffffffedc);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &this->errorString,__s);
            _Var9._M_payload = (_Storage<helics::MessageProcessingResult,_true>)0x7;
            _Var9._M_engaged = false;
          }
          goto LAB_0031aa13;
        }
      }
      else if (aVar2 == cmd_user_disconnect) {
LAB_0031a792:
        if (((this->state)._M_i != FINISHED) && ((this->state)._M_i != TERMINATING)) {
          BaseTimeCoordinator::disconnect
                    (&((this->timeCoord)._M_t.
                       super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                       .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl)->
                      super_BaseTimeCoordinator);
          (cmd->dest_id).gid = 0;
          if (((this->state)._M_i != ERRORED) && ((this->state)._M_i != TERMINATING)) {
            LOCK();
            (this->state)._M_i = TERMINATING;
            UNLOCK();
          }
          routeMessage(this,cmd);
        }
      }
      else if ((aVar2 == cmd_disconnect) || (aVar2 == cmd_disconnect_fed)) {
        fedId.gid = (cmd->source_id).gid;
        if (fedId.gid == (this->global_id)._M_i.gid) goto LAB_0031a792;
        TVar11 = BaseTimeCoordinator::getLastGrant
                           (&((this->timeCoord)._M_t.
                              super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                              .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl)
                             ->super_BaseTimeCoordinator,fedId);
        pTVar3 = (this->timeCoord)._M_t.
                 super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                 .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
        cVar7 = (**(code **)((long)(pTVar3->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator +
                            0x18))(pTVar3,cmd);
        bVar12 = true;
        if (cVar7 == '\0') {
          _Var9._M_payload = (_Storage<helics::MessageProcessingResult,_true>)0xfe;
          _Var9._M_engaged = false;
        }
        else if (cVar7 == '\x05') {
          addFederateToDelay(this,(GlobalFederateId)(cmd->source_id).gid);
          _Var9._M_payload = (_Storage<helics::MessageProcessingResult,_true>)0xff;
          _Var9._M_engaged = false;
        }
        else {
          bVar12 = false;
          _Var9 = unaff_BP;
          if ((this->state)._M_i == EXECUTING) {
            InterfaceInfo::disconnectFederate
                      (&this->interfaceInformation,(GlobalFederateId)(cmd->source_id).gid,TVar11);
            bVar12 = false;
            if (this->timeGranted_mode == false) {
              MVar8 = TimeCoordinator::checkTimeGrant
                                ((this->timeCoord)._M_t.
                                 super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                                 .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>.
                                 _M_head_impl,(GlobalFederateId)0x8831d580);
              if (DELAY_MESSAGE < MVar8) {
                pTVar3 = (this->timeCoord)._M_t.
                         super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                         .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
                (this->time_granted).internalTimeCode = (pTVar3->time_granted).internalTimeCode;
                (this->allowed_send_time).internalTimeCode =
                     (pTVar3->info).outputDelay.internalTimeCode +
                     (pTVar3->time_granted).internalTimeCode;
                this->timeGranted_mode = true;
                _Var9._M_engaged = false;
                _Var9._M_payload._M_value = MVar8;
              }
              bVar12 = DELAY_MESSAGE < MVar8;
            }
          }
        }
        if (bVar12) goto LAB_0031aa13;
      }
    }
    else if (aVar2 < cmd_log) {
      if (aVar2 == cmd_exec_request) {
        if (((cmd->source_id).gid == (this->global_id)._M_i.gid) && ((cmd->flags & 0x20) != 0)) {
          _Var9._M_payload._M_value = processDelayQueue(this);
          _Var9._M_engaged = false;
          if (_Var9._M_payload._M_value < NEXT_STEP) {
            ActionMessage::setAction(cmd,cmd_exec_check);
            _Var9._M_payload._M_value = processActionMessage(this,cmd);
            _Var9._M_engaged = false;
          }
          goto LAB_0031aa13;
        }
      }
      else {
        if (aVar2 == cmd_add_publisher) goto LAB_0031a556;
        if (aVar2 == cmd_pub) goto LAB_0031a7ee;
      }
    }
    else if (aVar2 < cmd_add_endpoint) {
      if (aVar2 == cmd_log) goto LAB_0031a7fe;
      if (aVar2 == cmd_add_subscriber) goto LAB_0031a556;
    }
    else if (aVar2 == cmd_add_endpoint) {
LAB_0031a556:
      processDataConnectionMessage(this,cmd);
    }
    else if (aVar2 == cmd_send_command_ordered) goto LAB_0031a76c;
  }
  else if (aVar2 < cmd_grant_timeout_check) {
    if (((uint)(aVar2 + ~cmd_remove_named_filter) < 0xc) &&
       ((0xd81U >> (aVar2 + ~cmd_remove_named_filter & 0x1fU) & 1) != 0)) goto LAB_0031a556;
    switch(aVar2) {
    case cmd_fed_configure_time:
      setProperty(this,cmd->messageID,(Time)(cmd->actionTime).internalTimeCode);
      break;
    case cmd_fed_configure_int:
      setProperty(this,cmd->messageID,(cmd->dest_handle).hid);
      break;
    case cmd_fed_configure_flag:
      setOptionFlag(this,cmd->messageID,SUB41((cmd->flags & 0x20) >> 5,0));
      break;
    case cmd_interface_configure:
      setInterfaceProperty(this,cmd);
    }
  }
  else if (aVar2 < cmd_timeout_disconnect) {
    if (aVar2 < cmd_query_ordered) {
      if (aVar2 == cmd_grant_timeout_check) {
        timeoutCheck(this,cmd);
      }
      else if (aVar2 == cmd_set_profiler_flag) goto LAB_0031a7fe;
    }
    else {
      if (aVar2 == cmd_query_ordered) goto LAB_0031a80e;
      if (aVar2 == cmd_global_disconnect) goto LAB_0031a792;
    }
  }
  else if (aVar2 < cmd_warning) {
    if ((aVar2 == cmd_timeout_disconnect) || (aVar2 == cmd_remote_log)) {
LAB_0031a7fe:
      processLoggingMessage(this,cmd);
    }
  }
  else {
    if (aVar2 == cmd_warning) goto LAB_0031a7fe;
    if (aVar2 == cmd_send_message) {
LAB_0031a7ee:
      processDataMessage(this,cmd);
    }
  }
  _Var9._M_payload = (_Storage<helics::MessageProcessingResult,_true>)0xfe;
  _Var9._M_engaged = false;
LAB_0031aa13:
  return _Var9._M_payload._M_value;
}

Assistant:

MessageProcessingResult FederateState::processActionMessage(ActionMessage& cmd)
{
    LOG_TRACE(fmt::format("processing command {}", prettyPrintString(cmd)));

    if (cmd.action() == CMD_TIME_REQUEST) {
        if ((cmd.source_id == global_id.load()) &&
            checkActionFlag(cmd, indicator_flag)) {  // this sets up a time request
            requestingMode.store(true);
            IterationRequest iterate = IterationRequest::NO_ITERATIONS;
            if (checkActionFlag(cmd, iteration_requested_flag)) {
                iterate = (checkActionFlag(cmd, required_flag)) ?
                    IterationRequest::FORCE_ITERATION :
                    IterationRequest::ITERATE_IF_NEEDED;
            }
            timeCoord->timeRequest(cmd.actionTime, iterate, nextValueTime(), nextMessageTime());
            timeGranted_mode = false;
            auto ret = processDelayQueue();
            if (returnableResult(ret)) {
                return ret;
            }
            cmd.setAction(CMD_TIME_CHECK);
        }
    }
    auto proc_result = processCoordinatorMessage(
        cmd, timeCoord.get(), getState(), timeGranted_mode, global_id.load());

    auto result = checkProcResult(proc_result, cmd);
    if (result) {
        return *result;
    }

    switch (cmd.action()) {
        case CMD_IGNORE:
        default:
            break;

        case CMD_EXEC_REQUEST:
            if ((cmd.source_id == global_id.load()) &&
                checkActionFlag(cmd, indicator_flag)) {  // this sets up a time request
                auto ret = processDelayQueue();
                if (returnableResult(ret)) {
                    return ret;
                }
                cmd.setAction(CMD_EXEC_CHECK);
                return processActionMessage(cmd);
            }
            break;
        case CMD_GLOBAL_DISCONNECT:
        case CMD_USER_DISCONNECT:
            if ((state != FederateStates::FINISHED) && (state != FederateStates::TERMINATING)) {
                timeCoord->disconnect();
                cmd.dest_id = parent_broker_id;
                if (state != FederateStates::ERRORED) {
                    setState(FederateStates::TERMINATING);
                }
                routeMessage(cmd);
            }
            break;
        case CMD_DISCONNECT_FED:
        case CMD_DISCONNECT:
            if (cmd.source_id == global_id.load()) {
                if ((state != FederateStates::FINISHED) && (state != FederateStates::TERMINATING)) {
                    timeCoord->disconnect();
                    cmd.dest_id = parent_broker_id;
                    if (state != FederateStates::ERRORED) {
                        setState(FederateStates::TERMINATING);
                    }
                    routeMessage(cmd);
                }
            } else {
                const Time lastTime = timeCoord->getLastGrant(cmd.source_id);
                switch (timeCoord->processTimeMessage(cmd)) {
                    case TimeProcessingResult::DELAY_PROCESSING:
                        addFederateToDelay(cmd.source_id);
                        return MessageProcessingResult::DELAY_MESSAGE;
                    case TimeProcessingResult::NOT_PROCESSED:
                        return MessageProcessingResult::CONTINUE_PROCESSING;
                    default:
                        break;
                }
                if (state != FederateStates::EXECUTING) {
                    break;
                }

                interfaceInformation.disconnectFederate(cmd.source_id, lastTime);
                if (!timeGranted_mode) {
                    auto ret = timeCoord->checkTimeGrant();
                    if (returnableResult(ret)) {
                        time_granted = timeCoord->getGrantedTime();
                        allowed_send_time = timeCoord->allowedSendTime();
                        timeGranted_mode = true;
                        return ret;
                    }
                }
            }
            break;
        case CMD_SEND_MESSAGE:
        case CMD_PUB:
            processDataMessage(cmd);
            break;
        case CMD_LOG:
        case CMD_REMOTE_LOG:
        case CMD_WARNING:
        case CMD_SET_PROFILER_FLAG:
        case CMD_TIMEOUT_DISCONNECT:
            processLoggingMessage(cmd);
            break;
        case CMD_GRANT_TIMEOUT_CHECK:
            timeoutCheck(cmd);
            break;
        case CMD_ADD_PUBLISHER:
        case CMD_ADD_SUBSCRIBER:
        case CMD_ADD_ENDPOINT:
        case CMD_REMOVE_NAMED_PUBLICATION:
        case CMD_REMOVE_PUBLICATION:
        case CMD_REMOVE_SUBSCRIBER:
        case CMD_REMOVE_ENDPOINT:
        case CMD_CLOSE_INTERFACE:
            processDataConnectionMessage(cmd);
            break;

        case CMD_FED_ACK:
            if (state != FederateStates::CREATED) {
                break;
            }
            if (cmd.name() == name) {
                if (checkActionFlag(cmd, error_flag)) {
                    setState(FederateStates::ERRORED);
                    errorString = commandErrorString(cmd.messageID);
                    return MessageProcessingResult::ERROR_RESULT;
                }
                if (checkActionFlag(cmd, global_timing_flag)) {
                    if (checkActionFlag(cmd, async_timing_flag)) {
                        timeMethod = TimeSynchronizationMethod::ASYNC;
                    } else {
                        timeMethod = TimeSynchronizationMethod::GLOBAL;
                        addDependent(gRootBrokerID);
                        addDependency(gRootBrokerID);
                        timeCoord->setAsParent(gRootBrokerID);
                    }
                    timeCoord->globalTime = true;
                }
                global_id = cmd.dest_id;
                interfaceInformation.setGlobalId(cmd.dest_id);
                timeCoord->setSourceId(global_id);
                return MessageProcessingResult::NEXT_STEP;
            }
            break;
        case CMD_FED_CONFIGURE_TIME:
            setProperty(cmd.messageID, cmd.actionTime);
            break;
        case CMD_FED_CONFIGURE_INT:
            setProperty(cmd.messageID, cmd.getExtraData());
            break;
        case CMD_FED_CONFIGURE_FLAG:
            setOptionFlag(cmd.messageID, checkActionFlag(cmd, indicator_flag));
            break;
        case CMD_INTERFACE_CONFIGURE:
            setInterfaceProperty(cmd);
            break;
        case CMD_SEND_COMMAND:
        case CMD_SEND_COMMAND_ORDERED:
            sendCommand(cmd);
            break;

        case CMD_QUERY_ORDERED:
        case CMD_QUERY: {
            ActionMessage queryResp(cmd.action() == CMD_QUERY ? CMD_QUERY_REPLY :
                                                                CMD_QUERY_REPLY_ORDERED);
            queryResp.dest_id = cmd.source_id;
            queryResp.source_id = cmd.dest_id;
            queryResp.messageID = cmd.messageID;
            queryResp.counter = cmd.counter;

            queryResp.payload = processQueryActual(cmd.payload.to_string());
            routeMessage(std::move(queryResp));
        } break;
    }
    return MessageProcessingResult::CONTINUE_PROCESSING;
}